

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commander.c
# Opt level: O0

void command_help(command_t *self)

{
  long lVar1;
  command_option_t *option;
  int i;
  command_t *self_local;
  
  printf("\n");
  printf("  Usage: %s %s\n",self->name,self->usage);
  printf("\n");
  printf("  Options:\n");
  printf("\n");
  for (option._4_4_ = 0; option._4_4_ < self->option_count; option._4_4_ = option._4_4_ + 1) {
    lVar1 = (long)option._4_4_;
    printf("    %s, %-25s %s\n",self->options[lVar1].small,self->options[lVar1].large_with_arg,
           self->options[lVar1].description);
  }
  printf("\n");
  exit(0);
}

Assistant:

void
command_help(command_t *self) {
  printf("\n");
  printf("  Usage: %s %s\n", self->name, self->usage);
  printf("\n");
  printf("  Options:\n");
  printf("\n");
  int i;
  for (i = 0; i < self->option_count; ++i) {
    command_option_t *option = &self->options[i];
    printf("    %s, %-25s %s\n"
      , option->small
      , option->large_with_arg
      , option->description);
  }
  printf("\n");
  exit(0);
}